

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O3

REF_STATUS ref_grid_deep_copy(REF_GRID_conflict *ref_grid_ptr,REF_GRID original)

{
  REF_DBL RVar1;
  REF_GRID_UNIT RVar2;
  REF_BOOL RVar3;
  uint uVar4;
  REF_GRID_conflict ref_mpi_ptr;
  undefined8 uVar5;
  char *pcVar6;
  long lVar7;
  
  ref_mpi_ptr = (REF_GRID_conflict)malloc(0x110);
  *ref_grid_ptr = ref_mpi_ptr;
  if (ref_mpi_ptr == (REF_GRID_conflict)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x50,
           "ref_grid_deep_copy","malloc *ref_grid_ptr of REF_GRID_STRUCT NULL");
    uVar4 = 2;
  }
  else {
    uVar4 = ref_mpi_deep_copy((REF_MPI *)ref_mpi_ptr,original->mpi);
    if (uVar4 == 0) {
      uVar4 = ref_node_deep_copy(&ref_mpi_ptr->node,ref_mpi_ptr->mpi,original->node);
      if (uVar4 == 0) {
        lVar7 = 0;
        do {
          uVar4 = ref_cell_deep_copy((REF_CELL *)((long)ref_mpi_ptr->cell + lVar7),
                                     *(REF_CELL *)((long)original->cell + lVar7));
          if (uVar4 != 0) {
            pcVar6 = "cell deep copy";
            uVar5 = 0x5e;
            goto LAB_00179fb3;
          }
          lVar7 = lVar7 + 8;
        } while (lVar7 != 0x80);
        ref_mpi_ptr->cell[0x10] = (REF_CELL)0x0;
        uVar4 = ref_geom_deep_copy(&ref_mpi_ptr->geom,original->geom);
        if (uVar4 == 0) {
          uVar4 = ref_gather_create(&ref_mpi_ptr->gather);
          if (uVar4 == 0) {
            uVar4 = ref_adapt_deep_copy(&ref_mpi_ptr->adapt,original->adapt);
            if (uVar4 == 0) {
              ref_mpi_ptr->interp = (REF_INTERP)0x0;
              ref_mpi_ptr->partitioner = original->partitioner;
              ref_mpi_ptr->partitioner_seed = 0;
              ref_mpi_ptr->partitioner_full = original->partitioner_full;
              ref_mpi_ptr->meshb_version = 0;
              RVar2 = original->unit;
              ref_mpi_ptr->coordinate_system = original->coordinate_system;
              ref_mpi_ptr->unit = RVar2;
              RVar1 = original->references[1];
              ref_mpi_ptr->references[0] = original->references[0];
              ref_mpi_ptr->references[1] = RVar1;
              RVar1 = original->references[3];
              ref_mpi_ptr->references[2] = original->references[2];
              ref_mpi_ptr->references[3] = RVar1;
              RVar1 = original->references[5];
              ref_mpi_ptr->references[4] = original->references[4];
              ref_mpi_ptr->references[5] = RVar1;
              ref_mpi_ptr->references[6] = original->references[6];
              RVar3 = original->surf;
              ref_mpi_ptr->twod = original->twod;
              ref_mpi_ptr->surf = RVar3;
              return 0;
            }
            pcVar6 = "adapt deep copy";
            uVar5 = 0x67;
          }
          else {
            pcVar6 = "gather create";
            uVar5 = 0x65;
          }
        }
        else {
          pcVar6 = "geom deep copy";
          uVar5 = 100;
        }
      }
      else {
        pcVar6 = "node deep copy";
        uVar5 = 0x59;
      }
    }
    else {
      pcVar6 = "deep copy ref_mpi";
      uVar5 = 0x55;
    }
LAB_00179fb3:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar5,
           "ref_grid_deep_copy",(ulong)uVar4,pcVar6);
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_grid_deep_copy(REF_GRID *ref_grid_ptr,
                                      REF_GRID original) {
  REF_INT group;
  REF_GRID ref_grid;

  ref_malloc(*ref_grid_ptr, 1, REF_GRID_STRUCT);

  ref_grid = *ref_grid_ptr;

  RSS(ref_mpi_deep_copy(&ref_grid_mpi(ref_grid), ref_grid_mpi(original)),
      "deep copy ref_mpi");

  RSS(ref_node_deep_copy(&ref_grid_node(ref_grid), ref_grid_mpi(ref_grid),
                         ref_grid_node(original)),
      "node deep copy");

  for (group = 0; group < REF_CELL_N_TYPE; group++) {
    RSS(ref_cell_deep_copy(&ref_grid_cell(ref_grid, group),
                           ref_grid_cell(original, group)),
        "cell deep copy");
  }

  ref_grid_cell(ref_grid, REF_CELL_N_TYPE) = NULL;

  RSS(ref_geom_deep_copy(&ref_grid_geom(ref_grid), ref_grid_geom(original)),
      "geom deep copy");
  RSS(ref_gather_create(&ref_grid_gather(ref_grid)), "gather create");
  RSS(ref_adapt_deep_copy(&(ref_grid->adapt), original->adapt),
      "adapt deep copy");

  ref_grid_interp(ref_grid) = NULL;

  ref_grid_partitioner(ref_grid) = ref_grid_partitioner(original);
  ref_grid_partitioner_seed(ref_grid) = 0;
  ref_grid_partitioner_full(ref_grid) = ref_grid_partitioner_full(original);

  ref_grid_meshb_version(ref_grid) = 0;
  ref_grid_coordinate_system(ref_grid) = ref_grid_coordinate_system(original);
  ref_grid_unit(ref_grid) = ref_grid_unit(original);
  ref_grid_reference(ref_grid, 0) = ref_grid_reference(original, 0);
  ref_grid_reference(ref_grid, 1) = ref_grid_reference(original, 1);
  ref_grid_reference(ref_grid, 2) = ref_grid_reference(original, 2);
  ref_grid_reference(ref_grid, 3) = ref_grid_reference(original, 3);
  ref_grid_reference(ref_grid, 4) = ref_grid_reference(original, 4);
  ref_grid_reference(ref_grid, 5) = ref_grid_reference(original, 5);
  ref_grid_reference(ref_grid, 6) = ref_grid_reference(original, 6);

  ref_grid_twod(ref_grid) = ref_grid_twod(original);
  ref_grid_surf(ref_grid) = ref_grid_surf(original);

  return REF_SUCCESS;
}